

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_line_aa_basics.cpp
# Opt level: O1

void agg::bisectrix(line_parameters *l1,line_parameters *l2,int *x,int *y)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  iVar2 = *(int *)l2;
  iVar1 = *(int *)(l2 + 4);
  dVar5 = (double)*(int *)(l2 + 8) -
          (double)(iVar2 - *(int *)l1) * ((double)*(int *)(l2 + 0x28) / (double)*(int *)(l1 + 0x28))
  ;
  dVar6 = (double)*(int *)(l2 + 0xc) -
          ((double)*(int *)(l2 + 0x28) / (double)*(int *)(l1 + 0x28)) *
          (double)(iVar1 - *(int *)(l1 + 4));
  if ((double)(*(int *)(l2 + 8) - iVar2) * (double)(iVar1 - *(int *)(l1 + 4)) <
      (double)(*(int *)(l2 + 0xc) - iVar1) * (double)(iVar2 - *(int *)l1) + 100.0) {
    dVar3 = dVar5 - (double)iVar2;
    dVar5 = dVar5 - (dVar3 + dVar3);
    dVar3 = dVar6 - (double)iVar1;
    dVar6 = dVar6 - (dVar3 + dVar3);
  }
  dVar3 = dVar5 - (double)iVar2;
  dVar4 = dVar6 - (double)iVar1;
  dVar3 = dVar3 * dVar3 + dVar4 * dVar4;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  if ((int)dVar3 < 0x100) {
    *x = (*(int *)l2 * 2 - *(int *)(l1 + 4)) + *(int *)(l2 + 0xc) >> 1;
    iVar2 = (*(int *)(l2 + 4) * 2 + *(int *)l1) - *(int *)(l2 + 8) >> 1;
  }
  else {
    *x = (int)((double)(~-(ulong)(dVar5 < 0.0) & 0x3fe0000000000000 |
                       -(ulong)(dVar5 < 0.0) & 0xbfe0000000000000) + dVar5);
    iVar2 = (int)((double)(~-(ulong)(dVar6 < 0.0) & 0x3fe0000000000000 |
                          -(ulong)(dVar6 < 0.0) & 0xbfe0000000000000) + dVar6);
  }
  *y = iVar2;
  return;
}

Assistant:

void bisectrix(const line_parameters& l1, 
                   const line_parameters& l2, 
                   int* x, int* y)
    {
        double k = double(l2.len) / double(l1.len);
        double tx = l2.x2 - (l2.x1 - l1.x1) * k;
        double ty = l2.y2 - (l2.y1 - l1.y1) * k;

        //All bisectrices must be on the right of the line
        //If the next point is on the left (l1 => l2.2)
        //then the bisectix should be rotated by 180 degrees.
        if(double(l2.x2 - l2.x1) * double(l2.y1 - l1.y1) <
           double(l2.y2 - l2.y1) * double(l2.x1 - l1.x1) + 100.0)
        {
            tx -= (tx - l2.x1) * 2.0;
            ty -= (ty - l2.y1) * 2.0;
        }

        // Check if the bisectrix is too short
        double dx = tx - l2.x1;
        double dy = ty - l2.y1;
        if((int)sqrt(dx * dx + dy * dy) < line_subpixel_scale)
        {
            *x = (l2.x1 + l2.x1 + (l2.y1 - l1.y1) + (l2.y2 - l2.y1)) >> 1;
            *y = (l2.y1 + l2.y1 - (l2.x1 - l1.x1) - (l2.x2 - l2.x1)) >> 1;
            return;
        }
        *x = iround(tx);
        *y = iround(ty);
    }